

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O3

InplaceStr
GetFunctionNameInScope
          (ExpressionContext *ctx,ScopeData *scope,TypeBase *parentType,InplaceStr str,
          bool isOperator,bool isAccessor)

{
  NamespaceData *pNVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  ScopeData *pSVar5;
  undefined4 extraout_var_00;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  ScopeData *curr;
  InplaceStr IVar13;
  
  pcVar11 = str.end;
  pcVar6 = str.begin;
  if (parentType == (TypeBase *)0x0) {
    if (isOperator) goto LAB_001da37f;
    if (isAccessor) {
      __assert_fail("!isAccessor",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x256,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
    if (scope == (ScopeData *)0x0) goto LAB_001da37f;
    uVar8 = (int)str.end - (int)str.begin;
    bVar2 = false;
    pSVar5 = scope;
    uVar10 = uVar8;
    do {
      if ((pSVar5->type == SCOPE_TEMPORARY) ||
         ((pSVar5->ownerFunction != (FunctionData *)0x0 && (!bVar2)))) goto LAB_001da37f;
      if ((pSVar5->ownerType != (TypeBase *)0x0) && (!bVar2)) {
        __assert_fail("foundNamespace",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                      ,0x267,
                      "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                     );
      }
      pNVar1 = pSVar5->ownerNamespace;
      if (pNVar1 != (NamespaceData *)0x0) {
        uVar10 = uVar10 + (*(int *)&(pNVar1->name).name.end - *(int *)&(pNVar1->name).name.begin) +
                 1;
        bVar2 = true;
      }
      pSVar5 = pSVar5->scope;
    } while (pSVar5 != (ScopeData *)0x0);
    if (!bVar2) goto LAB_001da37f;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar10 + 1));
    pcVar11 = (char *)CONCAT44(extraout_var_00,iVar3);
    pcVar11[(ulong)(uVar10 + 1) - 1] = '\0';
    pcVar12 = pcVar11 + ((ulong)(uVar10 + 1) - 1) + -(ulong)uVar8;
    memcpy(pcVar12,pcVar6,(ulong)uVar8);
    for (; scope != (ScopeData *)0x0; scope = scope->scope) {
      pNVar1 = scope->ownerNamespace;
      if (pNVar1 != (NamespaceData *)0x0) {
        pcVar6 = (pNVar1->name).name.begin;
        iVar3 = *(int *)&(pNVar1->name).name.end;
        pcVar12[-1] = '.';
        uVar7 = (ulong)(uint)(iVar3 - (int)pcVar6);
        pcVar12 = pcVar12 + (-1 - uVar7);
        memcpy(pcVar12,pcVar6,uVar7);
      }
    }
    if (pcVar12 != pcVar11) {
      __assert_fail("pos == name",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x28f,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
    sVar4 = strlen(pcVar11);
    pcVar6 = pcVar11;
  }
  else {
    uVar10 = (int)str.end - (int)str.begin;
    uVar7 = (ulong)((*(int *)&(parentType->name).end - *(int *)&(parentType->name).begin) +
                    uVar10 + isAccessor + 3);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar7);
    pcVar12 = (char *)CONCAT44(extraout_var,iVar3);
    pcVar11 = (parentType->name).begin;
    pcVar9 = "";
    if (isAccessor) {
      pcVar9 = "$";
    }
    NULLC::SafeSprintf(pcVar12,uVar7,"%.*s::%.*s%s",
                       (ulong)(uint)(*(int *)&(parentType->name).end - (int)pcVar11),pcVar11,
                       (ulong)uVar10,pcVar6,pcVar9);
    sVar4 = strlen(pcVar12);
    pcVar6 = pcVar12;
    if (sVar4 + 1 != uVar7) {
      __assert_fail("strlen(name) + 1 == nameLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x24f,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
  }
  pcVar11 = pcVar6 + sVar4;
LAB_001da37f:
  IVar13.end = pcVar11;
  IVar13.begin = pcVar6;
  return IVar13;
}

Assistant:

InplaceStr GetFunctionNameInScope(ExpressionContext &ctx, ScopeData *scope, TypeBase *parentType, InplaceStr str, bool isOperator, bool isAccessor)
{
	if(parentType)
	{
		unsigned nameLength = parentType->name.length() + 2 + str.length() + (isAccessor ? 1 : 0) + 1;
		char *name = (char*)ctx.allocator->alloc(nameLength);

		NULLC::SafeSprintf(name, nameLength, "%.*s::%.*s%s", FMT_ISTR(parentType->name), FMT_ISTR(str), isAccessor ? "$" : "");

		assert(strlen(name) + 1 == nameLength);
		return InplaceStr(name);
	}

	if(isOperator)
		return str;

	assert(!isAccessor);

	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		// Temporary scope is not evaluated
		if(curr->type == SCOPE_TEMPORARY)
			return str;

		// Function scope, just use the name
		if(curr->ownerFunction && !foundNamespace)
			return str;

		if(curr->ownerType)
			assert(foundNamespace);

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	pos -= str.length();
	memcpy(pos, str.begin, str.length());

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}